

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTDMT_freeJobsTable(ZSTDMT_jobDescription *jobTable,U32 nbJobs,ZSTD_customMem cMem)

{
  ZSTD_customMem customMem;
  uint in_ESI;
  long in_RDI;
  U32 jobNb;
  undefined8 in_stack_ffffffffffffffe0;
  undefined1 *puVar1;
  uint uVar2;
  
  puVar1 = &stack0x00000008;
  if (in_RDI != 0) {
    for (uVar2 = 0; uVar2 < in_ESI; uVar2 = uVar2 + 1) {
      pthread_mutex_destroy((pthread_mutex_t *)(in_RDI + (ulong)uVar2 * 0x1b8 + 0x10));
      pthread_cond_destroy((pthread_cond_t *)(in_RDI + (ulong)uVar2 * 0x1b8 + 0x38));
    }
    customMem.customFree = (ZSTD_freeFunction)puVar1;
    customMem.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffe0;
    customMem.opaque._0_4_ = uVar2;
    customMem.opaque._4_4_ = in_ESI;
    ZSTD_customFree(*(void **)(puVar1 + 8),customMem);
  }
  return;
}

Assistant:

static void ZSTDMT_freeJobsTable(ZSTDMT_jobDescription* jobTable, U32 nbJobs, ZSTD_customMem cMem)
{
    U32 jobNb;
    if (jobTable == NULL) return;
    for (jobNb=0; jobNb<nbJobs; jobNb++) {
        ZSTD_pthread_mutex_destroy(&jobTable[jobNb].job_mutex);
        ZSTD_pthread_cond_destroy(&jobTable[jobNb].job_cond);
    }
    ZSTD_customFree(jobTable, cMem);
}